

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O3

arg_info * __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  __pointer_type paVar1;
  __pointer_type paVar2;
  bool bVar3;
  
  paVar1 = (this->head_)._M_b._M_p;
  do {
    while (paVar2 = paVar1, ((ulong)paVar2 & 0xffffffffffff) == 0) {
      allocate(this);
      paVar1 = (this->head_)._M_b._M_p;
    }
    LOCK();
    paVar1 = (this->head_)._M_b._M_p;
    bVar3 = paVar2 == paVar1;
    if (bVar3) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)paVar2 & 0xffff000000000000 | 0xffffffffffff) +
            (*(ulong *)(((ulong)paVar2 & 0xffffffffffff) + 0x18) & 0xffffffffffff) + 1);
      paVar1 = paVar2;
    }
    UNLOCK();
  } while (!bVar3);
  return (arg_info *)((ulong)paVar2 & 0xffffffffffff);
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }